

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

BasicBlock * __thiscall
wasm::
CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
::startBasicBlock(CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  *this)

{
  __uniq_ptr_impl<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
  .
  super__Head_base<0UL,_wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_false>
  ._M_head_impl =
       (tuple<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
        )makeBasicBlock(this);
  this->currBasicBlock =
       (BasicBlock *)
       local_18._M_t.
       super__Tuple_impl<0UL,_wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
       .
       super__Head_base<0UL,_wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_false>
       ._M_head_impl;
  std::
  vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ::push_back(&this->basicBlocks,(value_type *)&local_18);
  std::
  unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
  ::~unique_ptr((unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
                 *)&local_18);
  return this->currBasicBlock;
}

Assistant:

BasicBlock* startBasicBlock() {
    currBasicBlock = ((SubType*)this)->makeBasicBlock();
    basicBlocks.push_back(std::unique_ptr<BasicBlock>(currBasicBlock));
    return currBasicBlock;
  }